

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void read_clip_setting(settings_r *sesskey,char *savekey,int def,Conf *conf,int confkey,
                      int strconfkey)

{
  int iVar1;
  char *__s1;
  
  __s1 = read_setting_s(sesskey,savekey);
  conf_set_str(conf,strconfkey,"");
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"implicit");
    if (iVar1 == 0) {
      def = 1;
    }
    else {
      iVar1 = strcmp(__s1,"explicit");
      if (iVar1 == 0) {
        def = 2;
      }
      else {
        iVar1 = strncmp(__s1,"custom:",7);
        def = 0;
        if (iVar1 == 0) {
          conf_set_str(conf,strconfkey,__s1 + 7);
          def = 3;
        }
      }
    }
  }
  conf_set_int(conf,confkey,def);
  safefree(__s1);
  return;
}

Assistant:

static void read_clip_setting(settings_r *sesskey, char *savekey,
                              int def, Conf *conf, int confkey, int strconfkey)
{
    char *setting = read_setting_s(sesskey, savekey);
    int val;

    conf_set_str(conf, strconfkey, "");
    if (!setting) {
        val = def;
    } else if (!strcmp(setting, "implicit")) {
        val = CLIPUI_IMPLICIT;
    } else if (!strcmp(setting, "explicit")) {
        val = CLIPUI_EXPLICIT;
    } else if (!strncmp(setting, "custom:", 7)) {
        val = CLIPUI_CUSTOM;
        conf_set_str(conf, strconfkey, setting + 7);
    } else {
        val = CLIPUI_NONE;
    }
    conf_set_int(conf, confkey, val);
    sfree(setting);
}